

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.c
# Opt level: O0

int dwarf_get_fde_info_for_cfa_reg3_b
              (Dwarf_Fde_conflict fde,Dwarf_Addr pc_requested,Dwarf_Small *value_type,
              Dwarf_Unsigned *offset_relevant,Dwarf_Unsigned *register_num,Dwarf_Unsigned *offset,
              Dwarf_Block *block,Dwarf_Addr *row_pc_out,Dwarf_Bool *has_more_rows,
              Dwarf_Addr *subsequent_pc,Dwarf_Error *error)

{
  int iVar1;
  Dwarf_Signed DStack_50;
  int res;
  Dwarf_Signed soff;
  Dwarf_Unsigned *offset_local;
  Dwarf_Unsigned *register_num_local;
  Dwarf_Unsigned *offset_relevant_local;
  Dwarf_Small *value_type_local;
  Dwarf_Addr pc_requested_local;
  Dwarf_Fde_conflict fde_local;
  
  DStack_50 = 0;
  soff = (Dwarf_Signed)offset;
  offset_local = register_num;
  register_num_local = offset_relevant;
  offset_relevant_local = (Dwarf_Unsigned *)value_type;
  value_type_local = (Dwarf_Small *)pc_requested;
  pc_requested_local = (Dwarf_Addr)fde;
  iVar1 = dwarf_get_fde_info_for_cfa_reg3_c
                    (fde,pc_requested,value_type,offset_relevant,register_num,
                     &stack0xffffffffffffffb0,block,row_pc_out,has_more_rows,subsequent_pc,error);
  if (soff != 0) {
    *(Dwarf_Signed *)soff = DStack_50;
  }
  return iVar1;
}

Assistant:

int
dwarf_get_fde_info_for_cfa_reg3_b(Dwarf_Fde fde,
    Dwarf_Addr      pc_requested,
    Dwarf_Small    *value_type,
    Dwarf_Unsigned *offset_relevant,
    Dwarf_Unsigned *register_num,
    Dwarf_Unsigned *offset,
    Dwarf_Block    *block,
    Dwarf_Addr     *row_pc_out,
    Dwarf_Bool     *has_more_rows,
    Dwarf_Addr     *subsequent_pc,
    Dwarf_Error    *error)
{
    Dwarf_Signed soff = 0;
    int res = 0;

    res = dwarf_get_fde_info_for_cfa_reg3_c(fde,
        pc_requested, value_type,offset_relevant,
        register_num,&soff,block, row_pc_out,
        has_more_rows,subsequent_pc,error);
    if (offset) {
        *offset = (Dwarf_Unsigned)soff;
    }
    return res;
}